

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcr.c
# Opt level: O0

void gcarrangementstack(void)

{
  LispPTR LVar1;
  LispPTR tmpnextblock;
  
  MachineState.csp = MachineState.csp + 2;
  *(LispPTR *)MachineState.csp = MachineState.tosvalue;
  MachineState.csp = MachineState.csp + 2;
  LVar1 = LAddrFromNative(MachineState.csp);
  MachineState.pvar[-5] = (DLword)LVar1;
  if (MachineState.endofstack == MachineState.csp) {
    error("creating 0-long stack block.");
  }
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
  *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
       (short)((ulong)((long)MachineState.endofstack - (long)MachineState.csp) >> 1);
  return;
}

Assistant:

void gcarrangementstack(void) {
  LispPTR tmpnextblock;
  PushCStack;
  tmpnextblock = LAddrFromNative(CurrentStackPTR += DLWORDSPER_CELL);
  CURRENTFX->nextblock = LOLOC(tmpnextblock);
  if ((UNSIGNED)EndSTKP == (UNSIGNED)CurrentStackPTR) error("creating 0-long stack block.");
  GETWORD(CurrentStackPTR) = STK_FSB_WORD;
  GETWORD(CurrentStackPTR + 1) = (((UNSIGNED)EndSTKP - (UNSIGNED)CurrentStackPTR) >> 1);
}